

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O3

void Abc_FlowRetime_ConstrainExact_back_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes,int latch)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  uint uVar4;
  long lVar5;
  
  uVar2 = *(uint *)&pObj->field_0x14;
  if ((uVar2 & 0xf) == 8) {
    if (latch != 0) {
      return;
    }
    latch = 1;
  }
  else if (latch == 0) {
    if ((uVar2 & 0x10) != 0) {
      return;
    }
    latch = 0;
    uVar4 = 0x10;
    goto LAB_00483ade;
  }
  uVar4 = 0x20;
  if ((uVar2 & 0x20) != 0) {
    return;
  }
LAB_00483ade:
  uVar2 = uVar2 | uVar4;
  *(uint *)&pObj->field_0x14 = uVar2;
  if (0 < (pObj->vFanouts).nSize) {
    lVar5 = 0;
    do {
      Abc_FlowRetime_ConstrainExact_back_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar5]],vNodes,latch
                );
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pObj->vFanouts).nSize);
    uVar2 = *(uint *)&pObj->field_0x14;
  }
  *(uint *)&pObj->field_0x14 = uVar2 & 0xfff;
  uVar2 = vNodes->nSize;
  if (uVar2 == vNodes->nCap) {
    if ((int)uVar2 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar3;
      vNodes->nCap = 0x10;
    }
    else {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
      }
      vNodes->pArray = ppvVar3;
      vNodes->nCap = uVar2 * 2;
    }
  }
  else {
    ppvVar3 = vNodes->pArray;
  }
  iVar1 = vNodes->nSize;
  vNodes->nSize = iVar1 + 1;
  ppvVar3[iVar1] = (void *)((ulong)(latch != 0) ^ (ulong)pObj);
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExact_back_rec( Abc_Obj_t * pObj, Vec_Ptr_t *vNodes, int latch ) {
  Abc_Obj_t *pNext;
  int i;

  // terminate?
  if (Abc_ObjIsLatch(pObj)) {
    if (latch) return;
    latch = 1;
  }

  // already visited?
  if (!latch) {
    if (pObj->fMarkA) return;
    pObj->fMarkA = 1;
  } else {
    if (pObj->fMarkB) return;
    pObj->fMarkB = 1;
  }

  // recurse
  Abc_ObjForEachFanout(pObj, pNext, i) {
    Abc_FlowRetime_ConstrainExact_back_rec( pNext, vNodes, latch );
  }

  // add
  pObj->Level = 0;
  Vec_PtrPush(vNodes, Abc_ObjNotCond(pObj, latch));
}